

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbi.cpp
# Opt level: O2

int32_t __thiscall icu_63::RuleBasedBreakIterator::handleNext(RuleBasedBreakIterator *this)

{
  UText *ut;
  UChar UVar1;
  ushort uVar2;
  int16_t key;
  uint uVar3;
  uint uVar4;
  RBBIStateTable *pRVar5;
  UTrie2 *pUVar6;
  uint16_t *puVar7;
  uint uVar8;
  bool bVar9;
  short key_00;
  int32_t iVar10;
  ulong uVar11;
  ulong uVar12;
  int64_t iVar13;
  uint uVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  long index;
  ulong local_b0;
  LookAheadResults lookAheadMatches;
  
  lookAheadMatches.fPositions[7] = 0;
  lookAheadMatches.fKeys[0] = 0;
  lookAheadMatches.fKeys[1] = 0;
  lookAheadMatches.fKeys[2] = 0;
  lookAheadMatches.fKeys[3] = 0;
  lookAheadMatches.fKeys[4] = 0;
  lookAheadMatches.fKeys[5] = 0;
  lookAheadMatches.fKeys[6] = 0;
  lookAheadMatches.fKeys[7] = 0;
  lookAheadMatches.fPositions[3] = 0;
  lookAheadMatches.fPositions[4] = 0;
  lookAheadMatches.fPositions[5] = 0;
  lookAheadMatches.fPositions[6] = 0;
  lookAheadMatches.fUsedSlotLimit = 0;
  lookAheadMatches.fPositions[0] = 0;
  lookAheadMatches.fPositions[1] = 0;
  lookAheadMatches.fPositions[2] = 0;
  pRVar5 = this->fData->fForwardTable;
  uVar3 = pRVar5->fRowLen;
  uVar11 = (ulong)uVar3;
  this->fRuleStatusIndex = 0;
  this->fDictionaryCharCount = 0;
  uVar4 = this->fPosition;
  index = (long)(int)uVar4;
  ut = &this->fText;
  uVar12 = index - (this->fText).chunkNativeStart;
  if ((((long)uVar12 < 0) || ((long)(this->fText).nativeIndexingLimit <= (long)uVar12)) ||
     (0xdbff < (ushort)(this->fText).chunkContents[uVar12])) {
    utext_setNativeIndex_63(ut,index);
    uVar12 = (ulong)(uint)(this->fText).chunkOffset;
  }
  else {
    (this->fText).chunkOffset = (int32_t)uVar12;
  }
  iVar15 = (int)uVar12;
  if ((iVar15 < (this->fText).chunkLength) &&
     (UVar1 = (this->fText).chunkContents[iVar15], uVar16 = (uint)(ushort)UVar1,
     (ushort)UVar1 < 0xd800)) {
    (this->fText).chunkOffset = iVar15 + 1;
  }
  else {
    uVar16 = utext_next32_63(ut);
    if (uVar16 == 0xffffffff) {
      this->fDone = '\x01';
      return -1;
    }
  }
  uVar17 = pRVar5->fFlags & 2;
  uVar18 = uVar17 >> 1 ^ 1;
  local_b0 = (ulong)uVar4;
LAB_0028e7a2:
  uVar14 = uVar16 >> 5;
  uVar8 = uVar14 + 0x140;
  if (0xdbff < uVar16) {
    uVar8 = uVar14;
  }
  do {
    uVar12 = (ulong)uVar17;
    if (uVar16 == 0xffffffff) {
      if (uVar18 == 2) goto LAB_0028e9f1;
      uVar12 = 1;
      bVar9 = false;
      uVar18 = 2;
    }
    else if (uVar18 == 1) {
      pUVar6 = this->fData->fTrie;
      puVar7 = pUVar6->index;
      uVar12 = (ulong)uVar14;
      if ((uVar16 < 0xd800) || (uVar12 = (ulong)uVar8, uVar16 < 0x10000)) {
LAB_0028e83a:
        iVar15 = (uVar16 & 0x1f) + (uint)puVar7[uVar12] * 4;
      }
      else if (uVar16 < 0x110000) {
        if ((int)uVar16 < pUVar6->highStart) {
          uVar12 = (ulong)((uint)puVar7[(ulong)(uVar16 >> 0xb) + 0x820] + (uVar14 & 0x3f));
          goto LAB_0028e83a;
        }
        iVar15 = pUVar6->highValueIndex;
      }
      else {
        iVar15 = pUVar6->indexLength + 0x80;
      }
      uVar2 = puVar7[iVar15];
      uVar12 = (ulong)uVar2;
      bVar9 = true;
      if ((uVar2 >> 0xe & 1) != 0) {
        this->fDictionaryCharCount = this->fDictionaryCharCount + 1;
        uVar12 = (ulong)(uVar2 & 0xbfff);
      }
      uVar18 = 1;
    }
    else {
      bVar9 = false;
    }
    uVar2 = *(ushort *)(pRVar5[1].fTableData + uVar12 * 2 + uVar11 + -0xc);
    uVar11 = (ulong)(uVar3 * uVar2);
    key_00 = *(short *)(pRVar5->fTableData + uVar11);
    if (key_00 == -1) {
      if (uVar18 == 0) {
LAB_0028e8cb:
        key_00 = -1;
      }
      else {
        uVar17 = (this->fText).chunkOffset;
        if ((int)uVar17 <= (this->fText).nativeIndexingLimit) {
          local_b0 = (ulong)uVar17 + (this->fText).chunkNativeStart;
          goto LAB_0028e8cb;
        }
        local_b0 = (*((this->fText).pFuncs)->mapOffsetToNative)(ut);
        key_00 = *(short *)(pRVar5->fTableData + uVar11);
      }
      this->fRuleStatusIndex = (int)*(short *)(pRVar5[1].fTableData + (uVar11 - 0x10));
    }
    if ((0 < key_00) &&
       (iVar10 = LookAheadResults::getPosition(&lookAheadMatches,key_00), -1 < iVar10)) {
      this->fRuleStatusIndex = (int)*(short *)(pRVar5[1].fTableData + (uVar11 - 0x10));
      this->fPosition = iVar10;
      return iVar10;
    }
    uVar17 = (uint)uVar12;
    key = *(int16_t *)(pRVar5->fTableData + uVar11 + 2);
    if (key != 0) {
      iVar15 = (this->fText).chunkOffset;
      if ((this->fText).nativeIndexingLimit < iVar15) {
        iVar13 = (*((this->fText).pFuncs)->mapOffsetToNative)(ut);
        iVar10 = (int32_t)iVar13;
      }
      else {
        iVar10 = iVar15 + (int)(this->fText).chunkNativeStart;
      }
      LookAheadResults::setPosition(&lookAheadMatches,key,iVar10);
    }
    if (uVar2 == 0) {
LAB_0028e9f1:
      if ((uint)local_b0 == uVar4) {
        utext_setNativeIndex_63(ut,index);
        utext_next32_63(ut);
        iVar13 = utext_getNativeIndex_63(ut);
        local_b0._0_4_ = (uint)iVar13;
        this->fRuleStatusIndex = 0;
      }
      this->fPosition = (uint)local_b0;
      return (uint)local_b0;
    }
    if (bVar9) break;
    uVar18 = uVar18 + (uVar18 == 0);
  } while( true );
  iVar15 = (this->fText).chunkOffset;
  if ((iVar15 < (this->fText).chunkLength) &&
     (uVar16 = (uint)(ushort)(this->fText).chunkContents[iVar15], uVar16 < 0xd800)) {
    (this->fText).chunkOffset = iVar15 + 1;
  }
  else {
    uVar16 = utext_next32_63(ut);
  }
  uVar18 = 1;
  goto LAB_0028e7a2;
}

Assistant:

int32_t getPosition(int16_t key) {
        for (int32_t i=0; i<fUsedSlotLimit; ++i) {
            if (fKeys[i] == key) {
                return fPositions[i];
            }
        }
        U_ASSERT(FALSE);
        return -1;
    }